

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS ref_search_home(REF_SEARCH ref_search,REF_INT child,REF_INT parent)

{
  int *piVar1;
  int iVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (child == -1) {
    pcVar9 = "empty child";
    uVar5 = 0x51;
LAB_001958a3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar5,
           "ref_search_home",pcVar9);
    return 1;
  }
  if (parent == -1) {
    pcVar9 = "empty parent";
    uVar5 = 0x52;
    goto LAB_001958a3;
  }
  if (child == parent) {
    return 0;
  }
  iVar2 = ref_search->d;
  dVar10 = 0.0;
  if (0 < (long)iVar2) {
    lVar7 = 0;
    do {
      dVar11 = ref_search->pos[iVar2 * parent + lVar7] - ref_search->pos[iVar2 * child + lVar7];
      dVar10 = dVar10 + dVar11 * dVar11;
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar11 = ref_search->children_ball[parent];
  dVar10 = dVar10 + ref_search->radius[child];
  if (dVar11 <= dVar10) {
    dVar11 = dVar10;
  }
  ref_search->children_ball[parent] = dVar11;
  pRVar4 = ref_search->left;
  piVar1 = pRVar4 + parent;
  if ((*piVar1 == -1) || (pRVar4 = ref_search->right, pRVar4[parent] == -1)) {
    pRVar4[parent] = child;
    return 0;
  }
  iVar2 = ref_search->d;
  dVar10 = 0.0;
  if (0 < (long)iVar2) {
    lVar7 = 0;
    do {
      dVar11 = ref_search->pos[*piVar1 * iVar2 + lVar7] - ref_search->pos[iVar2 * child + lVar7];
      dVar10 = dVar10 + dVar11 * dVar11;
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  lVar7 = (long)ref_search->d;
  dVar11 = 0.0;
  if (0 < lVar7) {
    lVar8 = 0;
    do {
      dVar12 = ref_search->pos[ref_search->right[parent] * lVar7 + lVar8] -
               ref_search->pos[ref_search->d * child + lVar8];
      dVar11 = dVar11 + dVar12 * dVar12;
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  if (dVar11 <= dVar10) {
    RVar3 = ref_search_home(ref_search,child,ref_search->right[parent]);
    if (RVar3 != 0) {
      pcVar9 = "recursively add to right child";
      uVar5 = 0x72;
      goto LAB_00195a4b;
    }
  }
  else {
    RVar3 = ref_search_home(ref_search,child,ref_search->left[parent]);
    if (RVar3 != 0) {
      pcVar9 = "recursively add to left child";
      uVar5 = 0x6f;
LAB_00195a4b:
      RVar6 = 1;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             uVar5,"ref_search_home",1,pcVar9);
      goto LAB_00195a5c;
    }
  }
  RVar6 = 0;
LAB_00195a5c:
  if (RVar3 != 0) {
    return RVar6;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_search_home(REF_SEARCH ref_search, REF_INT child,
                                          REF_INT parent) {
  REF_DBL child_distance;
  REF_DBL left_distance, right_distance;

  RUS(REF_EMPTY, child, "empty child");
  RUS(REF_EMPTY, parent, "empty parent");

  /* done, don't add self to children */
  if (child == parent) return REF_SUCCESS;

  RSS(ref_search_distance(ref_search, child, parent, &child_distance), "d");
  ref_search->children_ball[parent] =
      MAX(ref_search->children_ball[parent],
          child_distance + ref_search->radius[child]);

  if (REF_EMPTY == ref_search->left[parent]) {
    ref_search->left[parent] = child;
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_search->right[parent]) {
    ref_search->right[parent] = child;
    return REF_SUCCESS;
  }

  RSS(ref_search_distance(ref_search, child, ref_search->left[parent],
                          &left_distance),
      "left dist");
  RSS(ref_search_distance(ref_search, child, ref_search->right[parent],
                          &right_distance),
      "right dist");

  if (left_distance < right_distance) {
    RSS(ref_search_home(ref_search, child, ref_search->left[parent]),
        "recursively add to left child");
  } else {
    RSS(ref_search_home(ref_search, child, ref_search->right[parent]),
        "recursively add to right child");
  }

  return REF_SUCCESS;
}